

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  HierarchicalInstanceSyntax *pHVar1;
  Token TVar2;
  BumpAllocator *unaff_retaddr;
  BumpAllocator *in_stack_000000f8;
  SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *in_stack_00000100;
  BumpAllocator *in_stack_ffffffffffffffa8;
  InstanceNameSyntax *in_stack_ffffffffffffffb0;
  InstanceNameSyntax *local_48;
  Token *args_3;
  
  if (*(long *)(__fn + 0x18) == 0) {
    local_48 = (InstanceNameSyntax *)0x0;
  }
  else {
    local_48 = deepClone<slang::syntax::InstanceNameSyntax>
                         (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  TVar2 = parsing::Token::deepClone((Token *)in_stack_00000100,in_stack_000000f8);
  args_3 = (Token *)TVar2.info;
  deepClone<slang::syntax::PortConnectionSyntax>(in_stack_00000100,in_stack_000000f8);
  parsing::Token::deepClone((Token *)in_stack_00000100,in_stack_000000f8);
  pHVar1 = BumpAllocator::
           emplace<slang::syntax::HierarchicalInstanceSyntax,slang::syntax::InstanceNameSyntax*,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>&,slang::parsing::Token>
                     (unaff_retaddr,(InstanceNameSyntax **)__fn,(Token *)__child_stack,
                      (SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *)local_48,args_3);
  return (int)pHVar1;
}

Assistant:

static SyntaxNode* clone(const HierarchicalInstanceSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<HierarchicalInstanceSyntax>(
        node.decl ? deepClone(*node.decl, alloc) : nullptr,
        node.openParen.deepClone(alloc),
        *deepClone(node.connections, alloc),
        node.closeParen.deepClone(alloc)
    );
}